

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.h
# Opt level: O0

ssize_t __thiscall
sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::send
          (LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_> *this,int __fd,void *__buf
          ,size_t __n,int __flags)

{
  int iVar1;
  char *data;
  ssize_t extraout_RAX;
  void *__buf_00;
  undefined4 in_register_00000034;
  int local_68 [2];
  int32_t len;
  undefined1 local_58 [8];
  Buffer buf;
  StringPiece *message_local;
  TPTR *conn_local;
  LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_> *this_local;
  
  buf.m_wrapSize = (size_t)__buf;
  Buffer::Buffer((Buffer *)local_58,4,0x400);
  data = StringPiece::data((StringPiece *)buf.m_wrapSize);
  iVar1 = StringPiece::size((StringPiece *)buf.m_wrapSize);
  Buffer::append((Buffer *)local_58,data,(long)iVar1);
  local_68[0] = StringPiece::size((StringPiece *)buf.m_wrapSize);
  Buffer::prepend((Buffer *)local_58,local_68,4);
  TcpConnection::send((TcpConnection *)CONCAT44(in_register_00000034,__fd),(int)(Buffer *)local_58,
                      __buf_00,__n,__flags);
  Buffer::~Buffer((Buffer *)local_58);
  return extraout_RAX;
}

Assistant:

void send(TPTR* conn, const StringPiece& message)
	{
		Buffer buf;
		buf.append(message.data(), message.size());
		int32_t len = static_cast<int32_t>(message.size());
		buf.prepend(&len, sizeof(len));
		conn->send(&buf);
	}